

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.cpp
# Opt level: O0

void anon_unknown.dwarf_1013ab6::ripemd160::Transform(uint32_t *s,uchar *chunk)

{
  int iVar1;
  uint32_t r;
  int *in_RDI;
  long in_FS_OFFSET;
  uint32_t t;
  uint32_t w15;
  uint32_t w14;
  uint32_t w13;
  uint32_t w12;
  uint32_t w11;
  uint32_t w10;
  uint32_t w9;
  uint32_t w8;
  uint32_t w7;
  uint32_t w6;
  uint32_t w5;
  uint32_t w4;
  uint32_t w3;
  uint32_t w2;
  uint32_t w1;
  uint32_t w0;
  uint32_t e2;
  uint32_t d2;
  uint32_t c2;
  uint32_t b2;
  uint32_t a2;
  uint32_t e1;
  uint32_t d1;
  uint32_t c1;
  uint32_t b1;
  uint32_t a1;
  uchar *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff48;
  uint32_t uVar2;
  undefined8 in_stack_ffffffffffffff50;
  int *piVar3;
  uint32_t *in_stack_ffffffffffffff58;
  uint32_t *c;
  undefined8 in_stack_ffffffffffffff60;
  uint32_t uVar4;
  uint32_t *in_stack_ffffffffffffff68;
  uint32_t *a;
  int local_30;
  int local_2c;
  int local_28;
  uint32_t local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  uint32_t local_10;
  int local_c;
  long local_8;
  
  uVar4 = (uint32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  uVar2 = (uint32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = *in_RDI;
  local_24 = in_RDI[1];
  local_28 = in_RDI[2];
  local_2c = in_RDI[3];
  local_30 = in_RDI[4];
  local_1c = local_30;
  local_18 = local_2c;
  local_14 = local_28;
  local_10 = local_24;
  local_c = local_20;
  ReadLE32(in_stack_ffffffffffffff20);
  ReadLE32(in_stack_ffffffffffffff20);
  ReadLE32(in_stack_ffffffffffffff20);
  ReadLE32(in_stack_ffffffffffffff20);
  ReadLE32(in_stack_ffffffffffffff20);
  ReadLE32(in_stack_ffffffffffffff20);
  ReadLE32(in_stack_ffffffffffffff20);
  ReadLE32(in_stack_ffffffffffffff20);
  ReadLE32(in_stack_ffffffffffffff20);
  ReadLE32(in_stack_ffffffffffffff20);
  ReadLE32(in_stack_ffffffffffffff20);
  ReadLE32(in_stack_ffffffffffffff20);
  ReadLE32(in_stack_ffffffffffffff20);
  ReadLE32(in_stack_ffffffffffffff20);
  ReadLE32(in_stack_ffffffffffffff20);
  r = ReadLE32(in_stack_ffffffffffffff20);
  R11(in_stack_ffffffffffffff68,uVar4,in_stack_ffffffffffffff58,
      (uint32_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),(uint32_t)in_stack_ffffffffffffff50,uVar2
      ,r);
  uVar2 = (uint32_t)((ulong)&local_28 >> 0x20);
  R12(in_stack_ffffffffffffff68,uVar4,in_stack_ffffffffffffff58,
      (uint32_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),(uint32_t)in_stack_ffffffffffffff50,uVar2
      ,r);
  c = &local_10;
  R11(in_stack_ffffffffffffff68,uVar4,c,(uint32_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
      (uint32_t)in_stack_ffffffffffffff50,uVar2,r);
  piVar3 = &local_30;
  a = &local_24;
  R12(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  uVar4 = (uint32_t)((ulong)&local_18 >> 0x20);
  R11(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R12(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R11(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R12(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R11(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R12(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R11(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R12(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R11(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R12(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R11(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R12(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R11(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R12(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R11(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R12(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R11(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R12(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R11(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R12(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R11(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R12(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R11(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R12(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R11(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R12(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R11(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R12(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R21(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R22(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R21(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R22(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R21(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R22(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R21(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R22(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R21(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R22(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R21(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R22(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R21(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R22(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R21(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R22(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R21(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R22(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R21(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R22(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R21(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R22(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R21(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R22(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R21(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R22(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R21(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R22(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R21(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R22(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R21(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R22(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R31(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R32(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R31(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R32(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R31(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R32(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R31(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R32(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R31(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R32(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R31(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R32(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R31(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R32(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R31(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R32(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R31(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R32(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R31(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R32(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R31(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R32(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R31(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R32(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R31(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R32(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R31(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R32(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R31(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R32(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R31(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R32(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R41(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R42(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R41(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R42(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R41(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R42(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R41(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R42(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R41(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R42(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R41(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R42(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R41(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R42(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R41(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R42(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R41(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R42(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R41(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R42(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R41(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R42(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R41(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R42(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R41(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R42(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R41(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R42(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R41(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R42(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R41(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R42(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R51(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R52(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R51(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R52(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R51(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R52(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R51(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R52(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R51(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R52(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R51(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R52(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R51(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R52(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R51(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R52(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R51(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R52(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R51(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R52(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R51(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R52(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R51(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R52(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R51(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R52(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R51(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R52(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R51(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R52(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R51(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  R52(a,uVar4,c,(uint32_t)((ulong)piVar3 >> 0x20),(uint32_t)piVar3,uVar2,r);
  iVar1 = *in_RDI;
  *in_RDI = in_RDI[1] + local_14 + local_2c;
  in_RDI[1] = in_RDI[2] + local_18 + local_30;
  in_RDI[2] = in_RDI[3] + local_1c + local_20;
  in_RDI[3] = in_RDI[4] + local_c + local_24;
  in_RDI[4] = iVar1 + local_10 + local_28;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Transform(uint32_t* s, const unsigned char* chunk)
{
    uint32_t a1 = s[0], b1 = s[1], c1 = s[2], d1 = s[3], e1 = s[4];
    uint32_t a2 = a1, b2 = b1, c2 = c1, d2 = d1, e2 = e1;
    uint32_t w0 = ReadLE32(chunk + 0), w1 = ReadLE32(chunk + 4), w2 = ReadLE32(chunk + 8), w3 = ReadLE32(chunk + 12);
    uint32_t w4 = ReadLE32(chunk + 16), w5 = ReadLE32(chunk + 20), w6 = ReadLE32(chunk + 24), w7 = ReadLE32(chunk + 28);
    uint32_t w8 = ReadLE32(chunk + 32), w9 = ReadLE32(chunk + 36), w10 = ReadLE32(chunk + 40), w11 = ReadLE32(chunk + 44);
    uint32_t w12 = ReadLE32(chunk + 48), w13 = ReadLE32(chunk + 52), w14 = ReadLE32(chunk + 56), w15 = ReadLE32(chunk + 60);

    R11(a1, b1, c1, d1, e1, w0, 11);
    R12(a2, b2, c2, d2, e2, w5, 8);
    R11(e1, a1, b1, c1, d1, w1, 14);
    R12(e2, a2, b2, c2, d2, w14, 9);
    R11(d1, e1, a1, b1, c1, w2, 15);
    R12(d2, e2, a2, b2, c2, w7, 9);
    R11(c1, d1, e1, a1, b1, w3, 12);
    R12(c2, d2, e2, a2, b2, w0, 11);
    R11(b1, c1, d1, e1, a1, w4, 5);
    R12(b2, c2, d2, e2, a2, w9, 13);
    R11(a1, b1, c1, d1, e1, w5, 8);
    R12(a2, b2, c2, d2, e2, w2, 15);
    R11(e1, a1, b1, c1, d1, w6, 7);
    R12(e2, a2, b2, c2, d2, w11, 15);
    R11(d1, e1, a1, b1, c1, w7, 9);
    R12(d2, e2, a2, b2, c2, w4, 5);
    R11(c1, d1, e1, a1, b1, w8, 11);
    R12(c2, d2, e2, a2, b2, w13, 7);
    R11(b1, c1, d1, e1, a1, w9, 13);
    R12(b2, c2, d2, e2, a2, w6, 7);
    R11(a1, b1, c1, d1, e1, w10, 14);
    R12(a2, b2, c2, d2, e2, w15, 8);
    R11(e1, a1, b1, c1, d1, w11, 15);
    R12(e2, a2, b2, c2, d2, w8, 11);
    R11(d1, e1, a1, b1, c1, w12, 6);
    R12(d2, e2, a2, b2, c2, w1, 14);
    R11(c1, d1, e1, a1, b1, w13, 7);
    R12(c2, d2, e2, a2, b2, w10, 14);
    R11(b1, c1, d1, e1, a1, w14, 9);
    R12(b2, c2, d2, e2, a2, w3, 12);
    R11(a1, b1, c1, d1, e1, w15, 8);
    R12(a2, b2, c2, d2, e2, w12, 6);

    R21(e1, a1, b1, c1, d1, w7, 7);
    R22(e2, a2, b2, c2, d2, w6, 9);
    R21(d1, e1, a1, b1, c1, w4, 6);
    R22(d2, e2, a2, b2, c2, w11, 13);
    R21(c1, d1, e1, a1, b1, w13, 8);
    R22(c2, d2, e2, a2, b2, w3, 15);
    R21(b1, c1, d1, e1, a1, w1, 13);
    R22(b2, c2, d2, e2, a2, w7, 7);
    R21(a1, b1, c1, d1, e1, w10, 11);
    R22(a2, b2, c2, d2, e2, w0, 12);
    R21(e1, a1, b1, c1, d1, w6, 9);
    R22(e2, a2, b2, c2, d2, w13, 8);
    R21(d1, e1, a1, b1, c1, w15, 7);
    R22(d2, e2, a2, b2, c2, w5, 9);
    R21(c1, d1, e1, a1, b1, w3, 15);
    R22(c2, d2, e2, a2, b2, w10, 11);
    R21(b1, c1, d1, e1, a1, w12, 7);
    R22(b2, c2, d2, e2, a2, w14, 7);
    R21(a1, b1, c1, d1, e1, w0, 12);
    R22(a2, b2, c2, d2, e2, w15, 7);
    R21(e1, a1, b1, c1, d1, w9, 15);
    R22(e2, a2, b2, c2, d2, w8, 12);
    R21(d1, e1, a1, b1, c1, w5, 9);
    R22(d2, e2, a2, b2, c2, w12, 7);
    R21(c1, d1, e1, a1, b1, w2, 11);
    R22(c2, d2, e2, a2, b2, w4, 6);
    R21(b1, c1, d1, e1, a1, w14, 7);
    R22(b2, c2, d2, e2, a2, w9, 15);
    R21(a1, b1, c1, d1, e1, w11, 13);
    R22(a2, b2, c2, d2, e2, w1, 13);
    R21(e1, a1, b1, c1, d1, w8, 12);
    R22(e2, a2, b2, c2, d2, w2, 11);

    R31(d1, e1, a1, b1, c1, w3, 11);
    R32(d2, e2, a2, b2, c2, w15, 9);
    R31(c1, d1, e1, a1, b1, w10, 13);
    R32(c2, d2, e2, a2, b2, w5, 7);
    R31(b1, c1, d1, e1, a1, w14, 6);
    R32(b2, c2, d2, e2, a2, w1, 15);
    R31(a1, b1, c1, d1, e1, w4, 7);
    R32(a2, b2, c2, d2, e2, w3, 11);
    R31(e1, a1, b1, c1, d1, w9, 14);
    R32(e2, a2, b2, c2, d2, w7, 8);
    R31(d1, e1, a1, b1, c1, w15, 9);
    R32(d2, e2, a2, b2, c2, w14, 6);
    R31(c1, d1, e1, a1, b1, w8, 13);
    R32(c2, d2, e2, a2, b2, w6, 6);
    R31(b1, c1, d1, e1, a1, w1, 15);
    R32(b2, c2, d2, e2, a2, w9, 14);
    R31(a1, b1, c1, d1, e1, w2, 14);
    R32(a2, b2, c2, d2, e2, w11, 12);
    R31(e1, a1, b1, c1, d1, w7, 8);
    R32(e2, a2, b2, c2, d2, w8, 13);
    R31(d1, e1, a1, b1, c1, w0, 13);
    R32(d2, e2, a2, b2, c2, w12, 5);
    R31(c1, d1, e1, a1, b1, w6, 6);
    R32(c2, d2, e2, a2, b2, w2, 14);
    R31(b1, c1, d1, e1, a1, w13, 5);
    R32(b2, c2, d2, e2, a2, w10, 13);
    R31(a1, b1, c1, d1, e1, w11, 12);
    R32(a2, b2, c2, d2, e2, w0, 13);
    R31(e1, a1, b1, c1, d1, w5, 7);
    R32(e2, a2, b2, c2, d2, w4, 7);
    R31(d1, e1, a1, b1, c1, w12, 5);
    R32(d2, e2, a2, b2, c2, w13, 5);

    R41(c1, d1, e1, a1, b1, w1, 11);
    R42(c2, d2, e2, a2, b2, w8, 15);
    R41(b1, c1, d1, e1, a1, w9, 12);
    R42(b2, c2, d2, e2, a2, w6, 5);
    R41(a1, b1, c1, d1, e1, w11, 14);
    R42(a2, b2, c2, d2, e2, w4, 8);
    R41(e1, a1, b1, c1, d1, w10, 15);
    R42(e2, a2, b2, c2, d2, w1, 11);
    R41(d1, e1, a1, b1, c1, w0, 14);
    R42(d2, e2, a2, b2, c2, w3, 14);
    R41(c1, d1, e1, a1, b1, w8, 15);
    R42(c2, d2, e2, a2, b2, w11, 14);
    R41(b1, c1, d1, e1, a1, w12, 9);
    R42(b2, c2, d2, e2, a2, w15, 6);
    R41(a1, b1, c1, d1, e1, w4, 8);
    R42(a2, b2, c2, d2, e2, w0, 14);
    R41(e1, a1, b1, c1, d1, w13, 9);
    R42(e2, a2, b2, c2, d2, w5, 6);
    R41(d1, e1, a1, b1, c1, w3, 14);
    R42(d2, e2, a2, b2, c2, w12, 9);
    R41(c1, d1, e1, a1, b1, w7, 5);
    R42(c2, d2, e2, a2, b2, w2, 12);
    R41(b1, c1, d1, e1, a1, w15, 6);
    R42(b2, c2, d2, e2, a2, w13, 9);
    R41(a1, b1, c1, d1, e1, w14, 8);
    R42(a2, b2, c2, d2, e2, w9, 12);
    R41(e1, a1, b1, c1, d1, w5, 6);
    R42(e2, a2, b2, c2, d2, w7, 5);
    R41(d1, e1, a1, b1, c1, w6, 5);
    R42(d2, e2, a2, b2, c2, w10, 15);
    R41(c1, d1, e1, a1, b1, w2, 12);
    R42(c2, d2, e2, a2, b2, w14, 8);

    R51(b1, c1, d1, e1, a1, w4, 9);
    R52(b2, c2, d2, e2, a2, w12, 8);
    R51(a1, b1, c1, d1, e1, w0, 15);
    R52(a2, b2, c2, d2, e2, w15, 5);
    R51(e1, a1, b1, c1, d1, w5, 5);
    R52(e2, a2, b2, c2, d2, w10, 12);
    R51(d1, e1, a1, b1, c1, w9, 11);
    R52(d2, e2, a2, b2, c2, w4, 9);
    R51(c1, d1, e1, a1, b1, w7, 6);
    R52(c2, d2, e2, a2, b2, w1, 12);
    R51(b1, c1, d1, e1, a1, w12, 8);
    R52(b2, c2, d2, e2, a2, w5, 5);
    R51(a1, b1, c1, d1, e1, w2, 13);
    R52(a2, b2, c2, d2, e2, w8, 14);
    R51(e1, a1, b1, c1, d1, w10, 12);
    R52(e2, a2, b2, c2, d2, w7, 6);
    R51(d1, e1, a1, b1, c1, w14, 5);
    R52(d2, e2, a2, b2, c2, w6, 8);
    R51(c1, d1, e1, a1, b1, w1, 12);
    R52(c2, d2, e2, a2, b2, w2, 13);
    R51(b1, c1, d1, e1, a1, w3, 13);
    R52(b2, c2, d2, e2, a2, w13, 6);
    R51(a1, b1, c1, d1, e1, w8, 14);
    R52(a2, b2, c2, d2, e2, w14, 5);
    R51(e1, a1, b1, c1, d1, w11, 11);
    R52(e2, a2, b2, c2, d2, w0, 15);
    R51(d1, e1, a1, b1, c1, w6, 8);
    R52(d2, e2, a2, b2, c2, w3, 13);
    R51(c1, d1, e1, a1, b1, w15, 5);
    R52(c2, d2, e2, a2, b2, w9, 11);
    R51(b1, c1, d1, e1, a1, w13, 6);
    R52(b2, c2, d2, e2, a2, w11, 11);

    uint32_t t = s[0];
    s[0] = s[1] + c1 + d2;
    s[1] = s[2] + d1 + e2;
    s[2] = s[3] + e1 + a2;
    s[3] = s[4] + a1 + b2;
    s[4] = t + b1 + c2;
}